

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void Bpputrast(char *fn,float *bf,int sx,int sy,int r)

{
  ssize_t sVar1;
  undefined1 local_31;
  int local_30;
  int iStack_2c;
  uchar c;
  int j;
  int i;
  int fd;
  int r_local;
  int sy_local;
  int sx_local;
  float *bf_local;
  char *fn_local;
  
  i = r;
  fd = sy;
  r_local = sx;
  _sy_local = bf;
  bf_local = (float *)fn;
  j = creat(fn,0x180);
  if (j < 1) {
    error(9);
  }
  else {
    for (iStack_2c = 0; iStack_2c < fd; iStack_2c = iStack_2c + 1) {
      for (local_30 = 0; local_30 < r_local; local_30 = local_30 + 1) {
        local_31 = (undefined1)(int)_sy_local[i * iStack_2c + local_30];
        sVar1 = write(j,&local_31,1);
        if (sVar1 != 1) {
          error(7);
        }
      }
    }
  }
  close(j);
  return;
}

Assistant:

void Bpputrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        c = (unsigned char)bf[r*i + j] ;
        if (write(fd,&c,sizeof(c)) != 1) {
          error(7) ;
        }
      }
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}